

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForeachLoopStatementSyntax *syntax)

{
  NamedLabelSyntax *pNVar1;
  SourceLocation SVar2;
  StatementBlockSymbol *pSVar3;
  string_view sVar4;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar5;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffc0;
  Token local_38;
  
  SVar2 = parsing::Token::location(&syntax->keyword);
  pNVar1 = (syntax->super_StatementSyntax).label;
  if (pNVar1 == (NamedLabelSyntax *)0x0) {
    sVar4 = (string_view)(ZEXT816(0x477dec) << 0x40);
  }
  else {
    local_38.kind = (pNVar1->name).kind;
    local_38._2_1_ = (pNVar1->name).field_0x2;
    local_38.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_38.rawLen = (pNVar1->name).rawLen;
    local_38.info = (pNVar1->name).info;
    sVar4 = parsing::Token::valueText(&local_38);
    SVar2 = parsing::Token::location(&local_38);
  }
  name._M_str = (char *)SVar2;
  name._M_len = (size_t)sVar4._M_str;
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar4._M_len,name,
                       (SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffc0);
  sVar5 = Statement::createAndAddBlockItems(&pSVar3->super_Scope,(syntax->statement).ptr,false);
  pSVar3->blocks = sVar5;
  Scope::getOrAddDeferredData(&pSVar3->super_Scope);
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForeachLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.keyword.location());
    auto result = createBlock(scope, syntax, name, loc);
    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);

    // This block needs elaboration to collect iteration variables.
    result->setNeedElaboration();

    return *result;
}